

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void CLIntercept::contextCallbackCaller(char *errinfo,void *private_info,size_t cb,void *user_data)

{
  CLIntercept *this;
  allocator local_51;
  string local_50;
  
  this = *user_data;
  std::__cxx11::string::string((string *)&local_50,errinfo,&local_51);
  contextCallback(this,&local_50,private_info,cb);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)((long)user_data + 8) != (code *)0x0) {
    (**(code **)((long)user_data + 8))
              (errinfo,private_info,cb,*(undefined8 *)((long)user_data + 0x10));
  }
  return;
}

Assistant:

void CLIntercept::contextCallbackCaller(
    const char* errinfo,
    const void* private_info,
    size_t cb,
    void* user_data )
{
    SContextCallbackInfo*   pContextCallbackInfo =
        (SContextCallbackInfo*)user_data;

    pContextCallbackInfo->pIntercept->contextCallback(
        errinfo,
        private_info,
        cb );
    if( pContextCallbackInfo->pApplicationCallback )
    {
        pContextCallbackInfo->pApplicationCallback(
            errinfo,
            private_info,
            cb,
            pContextCallbackInfo->pUserData );
    }
}